

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::draw_rectangle
          (CImg<unsigned_char> *this,int x0,int y0,int z0,int c0,int x1,int y1,int z1,int c1,
          uchar val,float opacity)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int y;
  int iVar8;
  uchar *__s;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  
  bVar1 = is_empty(this);
  if (!bVar1) {
    uVar17 = -(uint)(x0 < x1);
    uVar18 = -(uint)(y0 < y1);
    uVar19 = -(uint)(z0 < z1);
    uVar20 = -(uint)(c0 < c1);
    uVar9 = x0 & uVar17 | ~uVar17 & x1;
    uVar10 = y0 & uVar18 | ~uVar18 & y1;
    uVar11 = z0 & uVar19 | ~uVar19 & z1;
    uVar12 = c0 & uVar20 | ~uVar20 & c1;
    uVar17 = ~uVar17 & x0 | x1 & uVar17;
    uVar18 = ~uVar18 & y0 | y1 & uVar18;
    uVar19 = ~uVar19 & z0 | z1 & uVar19;
    uVar20 = ~uVar20 & c0 | c1 & uVar20;
    iVar13 = (~-(uint)((int)uVar17 < (int)this->_width) & (uVar17 ^ 0xffffffff) + this->_width) +
             (-(uint)((int)uVar9 < 0) & uVar9) + (-(uint)(x1 < x0) - (x0 - x1 ^ -(uint)(x1 < x0))) +
             1;
    iVar14 = (~-(uint)((int)uVar18 < (int)this->_height) & (uVar18 ^ 0xffffffff) + this->_height) +
             (-(uint)((int)uVar10 < 0) & uVar10) + (-(uint)(y1 < y0) - (y0 - y1 ^ -(uint)(y1 < y0)))
             + 1;
    iVar15 = (~-(uint)((int)uVar19 < (int)this->_depth) & (uVar19 ^ 0xffffffff) + this->_depth) +
             (-(uint)((int)uVar11 < 0) & uVar11) + (-(uint)(z1 < z0) - (z0 - z1 ^ -(uint)(z1 < z0)))
             + 1;
    iVar16 = (~-(uint)((int)uVar20 < (int)this->_spectrum) & (uVar20 ^ 0xffffffff) + this->_spectrum
             ) + (-(uint)((int)uVar12 < 0) & uVar12) +
                 (-(uint)(c1 < c0) - (c0 - c1 ^ -(uint)(c1 < c0))) + 1;
    auVar21._0_4_ = -(uint)(iVar13 < 1);
    auVar21._4_4_ = -(uint)(iVar14 < 1);
    auVar21._8_4_ = -(uint)(iVar15 < 1);
    auVar21._12_4_ = -(uint)(iVar16 < 1);
    iVar2 = movmskps((int)this,auVar21);
    if (iVar2 == 0) {
      uVar5 = (ulong)this->_width;
      uVar17 = this->_height;
      lVar3 = uVar17 * uVar5;
      uVar18 = this->_depth;
      uVar7 = 0;
      uVar4 = (ulong)uVar9;
      if ((int)uVar9 < 1) {
        uVar4 = uVar7;
      }
      if ((int)uVar10 < 1) {
        uVar10 = 0;
      }
      uVar6 = (ulong)uVar11;
      if ((int)uVar11 < 1) {
        uVar6 = uVar7;
      }
      if ((int)uVar12 < 1) {
        uVar12 = 0;
      }
      __s = this->_data +
            (ulong)uVar18 * lVar3 * (ulong)uVar12 + uVar6 * lVar3 + uVar10 * uVar5 + uVar4;
      for (; (int)uVar7 != iVar16; uVar7 = (ulong)((int)uVar7 + 1)) {
        for (iVar2 = 0; iVar2 != iVar15; iVar2 = iVar2 + 1) {
          for (iVar8 = 0; iVar8 != iVar14; iVar8 = iVar8 + 1) {
            if (1.0 <= opacity) {
              memset(__s,(uint)val,(long)iVar13);
              uVar4 = (ulong)this->_width;
            }
            else {
              for (uVar4 = 0; iVar13 != (int)uVar4; uVar4 = uVar4 + 1) {
                __s[uVar4] = (uchar)(int)((float)__s[uVar4] *
                                          (1.0 - (float)(-(uint)(0.0 <= opacity) & (uint)opacity)) +
                                         (float)val * ABS(opacity));
              }
              __s = __s + (uVar5 - (long)iVar13);
            }
            __s = __s + uVar4;
          }
          __s = __s + (uVar17 - iVar14) * uVar5;
        }
        __s = __s + (ulong)(uVar18 - iVar15) * lVar3;
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& draw_rectangle(const int x0, const int y0, const int z0, const int c0,
                            const int x1, const int y1, const int z1, const int c1,
                            const T val, const float opacity=1) {
      if (is_empty()) return *this;
      const bool bx = (x0<x1), by = (y0<y1), bz = (z0<z1), bc = (c0<c1);
      const int
        nx0 = bx?x0:x1, nx1 = bx?x1:x0,
        ny0 = by?y0:y1, ny1 = by?y1:y0,
        nz0 = bz?z0:z1, nz1 = bz?z1:z0,
        nc0 = bc?c0:c1, nc1 = bc?c1:c0;
      const int
        lX = (1 + nx1 - nx0) + (nx1>=width()?width() - 1 - nx1:0) + (nx0<0?nx0:0),
        lY = (1 + ny1 - ny0) + (ny1>=height()?height() - 1 - ny1:0) + (ny0<0?ny0:0),
        lZ = (1 + nz1 - nz0) + (nz1>=depth()?depth() - 1 - nz1:0) + (nz0<0?nz0:0),
        lC = (1 + nc1 - nc0) + (nc1>=spectrum()?spectrum() - 1 - nc1:0) + (nc0<0?nc0:0);
      const unsigned long
        offX = (unsigned long)_width - lX,
        offY = (unsigned long)_width*(_height - lY),
        offZ = (unsigned long)_width*_height*(_depth - lZ);
      const float nopacity = cimg::abs(opacity), copacity = 1 - cimg::max(opacity,0);
      T *ptrd = data(nx0<0?0:nx0,ny0<0?0:ny0,nz0<0?0:nz0,nc0<0?0:nc0);
      if (lX>0 && lY>0 && lZ>0 && lC>0)
        for (int v = 0; v<lC; ++v) {
          for (int z = 0; z<lZ; ++z) {
            for (int y = 0; y<lY; ++y) {
              if (opacity>=1) {
                if (sizeof(T)!=1) { for (int x = 0; x<lX; ++x) *(ptrd++) = val; ptrd+=offX; }
                else { std::memset(ptrd,(int)val,lX); ptrd+=_width; }
              } else { for (int x = 0; x<lX; ++x) { *ptrd = (T)(nopacity*val + *ptrd*copacity); ++ptrd; } ptrd+=offX; }
            }
            ptrd+=offY;
          }
          ptrd+=offZ;
        }
      return *this;
    }